

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O0

int PreprocessARGB(uint8_t *r_ptr,uint8_t *g_ptr,uint8_t *b_ptr,int step,int rgb_stride,
                  WebPPicture *picture)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int uv_w_00;
  fixed_y_t *best_y_00;
  uint16_t *puVar5;
  uint16_t *puVar6;
  uint16_t *puVar7;
  fixed_y_t *pfVar8;
  int16_t *piVar9;
  int16_t *piVar10;
  ulong uVar11;
  uint64_t uVar12;
  WebPPicture *in_R9;
  double dVar13;
  fixed_t *next_uv;
  fixed_y_t *src2_1;
  fixed_y_t *src1_1;
  uint64_t diff_y_sum;
  fixed_t *prev_uv;
  fixed_t *cur_uv;
  fixed_y_t *src2;
  fixed_y_t *src1;
  int is_last_row;
  int ok;
  uint64_t diff_y_threshold;
  fixed_t *target_uv;
  fixed_t *best_uv;
  fixed_y_t *target_y;
  fixed_y_t *best_y;
  fixed_t *best_rgb_uv;
  fixed_t *target_uv_base;
  fixed_t *best_uv_base;
  fixed_y_t *best_rgb_y;
  fixed_y_t *target_y_base;
  fixed_y_t *best_y_base;
  fixed_y_t *tmp_buffer;
  int iter;
  int j;
  uint64_t prev_diff_y_sum;
  int uv_h;
  int uv_w;
  int h;
  int w;
  fixed_y_t *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  fixed_y_t *in_stack_ffffffffffffff00;
  fixed_y_t *src;
  fixed_y_t *src2_00;
  fixed_y_t *in_stack_ffffffffffffff10;
  fixed_y_t *cur_uv_00;
  fixed_y_t *pfVar14;
  ulong local_d8;
  fixed_y_t *local_c8;
  WebPPicture *in_stack_ffffffffffffff40;
  fixed_y_t *in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int16_t *local_a0;
  fixed_y_t *local_98;
  uint16_t *local_90;
  uint16_t *local_88;
  int local_48;
  int local_44;
  ulong local_40;
  
  uVar1 = in_R9->width + 1;
  uVar2 = uVar1 & 0xfffffffe;
  uVar3 = in_R9->height + 1U & 0xfffffffe;
  iVar4 = (int)uVar1 >> 1;
  local_40 = 0xffffffffffffffff;
  src2_00 = (fixed_y_t *)0x2;
  best_y_00 = (fixed_y_t *)
              WebPSafeMalloc(CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  puVar5 = (uint16_t *)
           WebPSafeMalloc(CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                          CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  puVar6 = (uint16_t *)
           WebPSafeMalloc(CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                          CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  puVar7 = (uint16_t *)
           WebPSafeMalloc(CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                          CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  pfVar8 = (fixed_y_t *)
           WebPSafeMalloc(CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                          CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  piVar9 = (int16_t *)
           WebPSafeMalloc(CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                          CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  piVar10 = (int16_t *)
            WebPSafeMalloc(CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                           CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  dVar13 = (double)(int)uVar2 * 3.0 * (double)(int)uVar3;
  uVar11 = (ulong)dVar13;
  if (((((puVar5 == (uint16_t *)0x0) || (pfVar8 == (fixed_y_t *)0x0)) || (puVar6 == (uint16_t *)0x0)
       ) || ((piVar9 == (int16_t *)0x0 || (puVar7 == (uint16_t *)0x0)))) ||
     ((piVar10 == (int16_t *)0x0 || (best_y_00 == (fixed_y_t *)0x0)))) {
    iVar4 = WebPEncodingSetError(in_R9,VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  else {
    WebPInitConvertARGBToYUV();
    local_a0 = piVar9;
    local_98 = pfVar8;
    for (local_44 = 0; local_44 < in_R9->height; local_44 = local_44 + 2) {
      in_stack_ffffffffffffff50 = (uint)(local_44 == in_R9->height + -1);
      in_stack_ffffffffffffff40 = (WebPPicture *)(best_y_00 + (int)(uVar2 * 3));
      in_stack_ffffffffffffff48 = best_y_00;
      ImportOneRow((uint8_t *)in_stack_ffffffffffffff10,(uint8_t *)src2_00,
                   (uint8_t *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                   in_stack_fffffffffffffef8,
                   (fixed_y_t *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      if (in_stack_ffffffffffffff50 == 0) {
        ImportOneRow((uint8_t *)in_stack_ffffffffffffff10,(uint8_t *)src2_00,
                     (uint8_t *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                     in_stack_fffffffffffffef8,
                     (fixed_y_t *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      }
      else {
        memcpy(in_stack_ffffffffffffff40,in_stack_ffffffffffffff48,(long)(int)(uVar2 * 3) << 1);
      }
      StoreGray((fixed_y_t *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                in_stack_fffffffffffffee8,0);
      StoreGray((fixed_y_t *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                in_stack_fffffffffffffee8,0);
      UpdateW(in_stack_ffffffffffffff00,
              (fixed_y_t *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
              in_stack_fffffffffffffef4);
      UpdateW(in_stack_ffffffffffffff00,
              (fixed_y_t *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
              in_stack_fffffffffffffef4);
      UpdateChroma(in_stack_ffffffffffffff10,src2_00,(fixed_t *)in_stack_ffffffffffffff00,
                   in_stack_fffffffffffffefc);
      memcpy(local_98,local_a0,(long)(iVar4 * 3) << 1);
      local_98 = local_98 + iVar4 * 3;
      local_a0 = local_a0 + iVar4 * 3;
    }
    for (local_48 = 0; local_48 < 4; local_48 = local_48 + 1) {
      local_d8 = 0;
      pfVar14 = pfVar8;
      local_c8 = pfVar8;
      local_a0 = piVar9;
      local_98 = pfVar8;
      local_90 = puVar6;
      local_88 = puVar5;
      for (local_44 = 0; local_44 < (int)uVar3; local_44 = local_44 + 2) {
        if (local_44 < (int)(uVar3 - 2)) {
          uv_w_00 = iVar4 * 3;
        }
        else {
          uv_w_00 = 0;
        }
        cur_uv_00 = local_c8 + uv_w_00;
        src = local_c8;
        InterpolateTwoRows(best_y_00,(fixed_t *)(best_y_00 + (int)(uVar2 * 3)),(fixed_t *)cur_uv_00,
                           (fixed_t *)src2_00,(int)((ulong)local_c8 >> 0x20),
                           (fixed_y_t *)CONCAT44(uv_w_00,in_stack_fffffffffffffef8),pfVar14);
        pfVar14 = cur_uv_00;
        UpdateW(src,(fixed_y_t *)CONCAT44(uv_w_00,in_stack_fffffffffffffef8),
                in_stack_fffffffffffffef4);
        UpdateW(src,(fixed_y_t *)CONCAT44(uv_w_00,in_stack_fffffffffffffef8),
                in_stack_fffffffffffffef4);
        UpdateChroma(pfVar14,src2_00,(fixed_t *)src,uv_w_00);
        uVar12 = (*WebPSharpYUVUpdateY)(local_90,puVar7,local_88,uVar2 << 1);
        local_d8 = uVar12 + local_d8;
        (*WebPSharpYUVUpdateRGB)(local_a0,piVar10,(int16_t *)local_98,iVar4 * 3);
        local_88 = local_88 + (int)(uVar2 << 1);
        local_98 = local_98 + iVar4 * 3;
        local_90 = local_90 + (int)(uVar2 << 1);
        local_a0 = local_a0 + iVar4 * 3;
        pfVar14 = local_c8;
        local_c8 = cur_uv_00;
      }
      if ((0 < local_48) &&
         ((local_d8 < (uVar11 | (long)(dVar13 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f) ||
          (local_40 < local_d8)))) break;
      local_40 = local_d8;
    }
    iVar4 = ConvertWRGBToYUV((fixed_y_t *)
                             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                             (fixed_t *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  }
  WebPSafeFree((void *)0x15938b);
  WebPSafeFree((void *)0x159398);
  WebPSafeFree((void *)0x1593a5);
  WebPSafeFree((void *)0x1593b2);
  WebPSafeFree((void *)0x1593bf);
  WebPSafeFree((void *)0x1593cc);
  WebPSafeFree((void *)0x1593d9);
  return iVar4;
}

Assistant:

static int PreprocessARGB(const uint8_t* r_ptr,
                          const uint8_t* g_ptr,
                          const uint8_t* b_ptr,
                          int step, int rgb_stride,
                          WebPPicture* const picture) {
  // we expand the right/bottom border if needed
  const int w = (picture->width + 1) & ~1;
  const int h = (picture->height + 1) & ~1;
  const int uv_w = w >> 1;
  const int uv_h = h >> 1;
  uint64_t prev_diff_y_sum = ~0;
  int j, iter;

  // TODO(skal): allocate one big memory chunk. But for now, it's easier
  // for valgrind debugging to have several chunks.
  fixed_y_t* const tmp_buffer = SAFE_ALLOC(w * 3, 2, fixed_y_t);   // scratch
  fixed_y_t* const best_y_base = SAFE_ALLOC(w, h, fixed_y_t);
  fixed_y_t* const target_y_base = SAFE_ALLOC(w, h, fixed_y_t);
  fixed_y_t* const best_rgb_y = SAFE_ALLOC(w, 2, fixed_y_t);
  fixed_t* const best_uv_base = SAFE_ALLOC(uv_w * 3, uv_h, fixed_t);
  fixed_t* const target_uv_base = SAFE_ALLOC(uv_w * 3, uv_h, fixed_t);
  fixed_t* const best_rgb_uv = SAFE_ALLOC(uv_w * 3, 1, fixed_t);
  fixed_y_t* best_y = best_y_base;
  fixed_y_t* target_y = target_y_base;
  fixed_t* best_uv = best_uv_base;
  fixed_t* target_uv = target_uv_base;
  const uint64_t diff_y_threshold = (uint64_t)(3.0 * w * h);
  int ok;

  if (best_y_base == NULL || best_uv_base == NULL ||
      target_y_base == NULL || target_uv_base == NULL ||
      best_rgb_y == NULL || best_rgb_uv == NULL ||
      tmp_buffer == NULL) {
    ok = WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto End;
  }
  assert(picture->width >= kMinDimensionIterativeConversion);
  assert(picture->height >= kMinDimensionIterativeConversion);

  WebPInitConvertARGBToYUV();

  // Import RGB samples to W/RGB representation.
  for (j = 0; j < picture->height; j += 2) {
    const int is_last_row = (j == picture->height - 1);
    fixed_y_t* const src1 = tmp_buffer + 0 * w;
    fixed_y_t* const src2 = tmp_buffer + 3 * w;

    // prepare two rows of input
    ImportOneRow(r_ptr, g_ptr, b_ptr, step, picture->width, src1);
    if (!is_last_row) {
      ImportOneRow(r_ptr + rgb_stride, g_ptr + rgb_stride, b_ptr + rgb_stride,
                   step, picture->width, src2);
    } else {
      memcpy(src2, src1, 3 * w * sizeof(*src2));
    }
    StoreGray(src1, best_y + 0, w);
    StoreGray(src2, best_y + w, w);

    UpdateW(src1, target_y, w);
    UpdateW(src2, target_y + w, w);
    UpdateChroma(src1, src2, target_uv, uv_w);
    memcpy(best_uv, target_uv, 3 * uv_w * sizeof(*best_uv));
    best_y += 2 * w;
    best_uv += 3 * uv_w;
    target_y += 2 * w;
    target_uv += 3 * uv_w;
    r_ptr += 2 * rgb_stride;
    g_ptr += 2 * rgb_stride;
    b_ptr += 2 * rgb_stride;
  }

  // Iterate and resolve clipping conflicts.
  for (iter = 0; iter < kNumIterations; ++iter) {
    const fixed_t* cur_uv = best_uv_base;
    const fixed_t* prev_uv = best_uv_base;
    uint64_t diff_y_sum = 0;

    best_y = best_y_base;
    best_uv = best_uv_base;
    target_y = target_y_base;
    target_uv = target_uv_base;
    for (j = 0; j < h; j += 2) {
      fixed_y_t* const src1 = tmp_buffer + 0 * w;
      fixed_y_t* const src2 = tmp_buffer + 3 * w;
      {
        const fixed_t* const next_uv = cur_uv + ((j < h - 2) ? 3 * uv_w : 0);
        InterpolateTwoRows(best_y, prev_uv, cur_uv, next_uv, w, src1, src2);
        prev_uv = cur_uv;
        cur_uv = next_uv;
      }

      UpdateW(src1, best_rgb_y + 0 * w, w);
      UpdateW(src2, best_rgb_y + 1 * w, w);
      UpdateChroma(src1, src2, best_rgb_uv, uv_w);

      // update two rows of Y and one row of RGB
      diff_y_sum += WebPSharpYUVUpdateY(target_y, best_rgb_y, best_y, 2 * w);
      WebPSharpYUVUpdateRGB(target_uv, best_rgb_uv, best_uv, 3 * uv_w);

      best_y += 2 * w;
      best_uv += 3 * uv_w;
      target_y += 2 * w;
      target_uv += 3 * uv_w;
    }
    // test exit condition
    if (iter > 0) {
      if (diff_y_sum < diff_y_threshold) break;
      if (diff_y_sum > prev_diff_y_sum) break;
    }
    prev_diff_y_sum = diff_y_sum;
  }
  // final reconstruction
  ok = ConvertWRGBToYUV(best_y_base, best_uv_base, picture);

 End:
  WebPSafeFree(best_y_base);
  WebPSafeFree(best_uv_base);
  WebPSafeFree(target_y_base);
  WebPSafeFree(target_uv_base);
  WebPSafeFree(best_rgb_y);
  WebPSafeFree(best_rgb_uv);
  WebPSafeFree(tmp_buffer);
  return ok;
}